

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::VariableRead::VariableRead
          (VariableRead *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer *ppfVar1;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess CVar2;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry> first_00;
  ConstValueRangeAccess valueRange_01;
  ConstValueRangeAccess value;
  IsReadableIntersectingEntry filter_00;
  IsReadableIntersectingEntry filter_01;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry> __first;
  ConstValueRangeAccess entryValueRange;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry> last;
  ConstValueRangeAccess readValueRange;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry> __last;
  Scalar *pSVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  VariableType *pVVar8;
  ShaderParameters *pSVar9;
  VariableManager *pVVar10;
  Variable *pVVar11;
  size_type sVar12;
  reference ppVVar13;
  reference pvVar14;
  Random *pRVar15;
  iterator first_01;
  iterator last_00;
  ValueEntry *pVVar16;
  float fVar17;
  Scalar *pSVar18;
  bool local_52c;
  bool local_52a;
  bool local_4a3;
  bool local_4a2;
  ValueRangeAccess local_460;
  VariableType *local_448;
  Scalar *pSStack_440;
  Scalar *local_438;
  ConstValueRangeAccess local_430;
  undefined1 local_418 [8];
  ValueRange intersection;
  ValueEntry *entry;
  ConstValueRangeAccess local_360;
  int local_344;
  undefined1 auStack_340 [4];
  int ndx;
  _Iter local_338;
  ValueEntry **local_330;
  insert_iterator<std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_328;
  Scalar *local_318;
  ValueEntry **ppVStack_310;
  ValueEntry **local_308;
  IsReadableIntersectingEntry IStack_300;
  ValueEntry **ppVStack_2e0;
  ValueEntry **local_2d8;
  undefined1 auStack_2d0 [32];
  vector<float,_std::allocator<float>_> weights;
  vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> availableVars;
  bool createVar;
  float createOnReadWeight;
  IsReadableIntersectingEntry local_248;
  undefined1 auStack_228 [8];
  Iterator end;
  IsReadableIntersectingEntry local_1e0;
  undefined1 auStack_1c0 [8];
  Iterator first;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry> local_188;
  deUint32 local_16c;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry> local_168;
  ValueRangeAccess local_150;
  VariableType *local_138;
  Scalar *pSStack_130;
  Scalar *local_128;
  ValueRangeAccess local_120;
  VariableType local_108;
  undefined1 local_b8 [8];
  ValueRange newVarRange;
  IsReadableEntry IStack_28;
  bool useRandomRange;
  int maxScalars;
  IsReadableEntry filter;
  GeneratorState *state_local;
  VariableRead *this_local;
  
  VariableAccess::VariableAccess(&this->super_VariableAccess);
  (this->super_VariableAccess).super_Expression._vptr_Expression =
       (_func_int **)&PTR__VariableRead_032ea598;
  pVVar8 = ConstValueRangeAccess::getType(&valueRange);
  bVar4 = VariableType::isVoid(pVVar8);
  if (bVar4) {
    dVar7 = GeneratorState::getExpressionFlags(state);
    rsg::anon_unknown_0::IsReadableEntry::IsReadableEntry(&stack0xffffffffffffffd8,dVar7);
    pSVar9 = GeneratorState::getShaderParameters(state);
    iVar6 = pSVar9->maxCombinedVariableScalars;
    pVVar10 = GeneratorState::getVariableManager(state);
    iVar5 = VariableManager::getNumAllocatedScalars(pVVar10);
    iVar6 = iVar6 - iVar5;
    pVVar10 = GeneratorState::getVariableManager(state);
    newVarRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = IStack_28.m_exprFlags;
    bVar4 = VariableManager::hasEntry<rsg::(anonymous_namespace)::IsReadableEntry>
                      (pVVar10,IStack_28);
    local_4a2 = true;
    if (bVar4) {
      local_4a3 = false;
      if (0 < iVar6) {
        pRVar15 = GeneratorState::getRandom(state);
        local_4a3 = rsg::anon_unknown_0::getWeightedBool(pRVar15,0.5);
      }
      local_4a2 = local_4a3;
    }
    if (local_4a2 == false) {
      pRVar15 = GeneratorState::getRandom(state);
      pVVar10 = GeneratorState::getVariableManager(state);
      local_16c = IStack_28.m_exprFlags;
      VariableManager::getBegin<rsg::(anonymous_namespace)::IsReadableEntry>
                (&local_168,pVVar10,IStack_28);
      pVVar10 = GeneratorState::getVariableManager(state);
      first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter.m_valueRange.m_max._4_4_ = IStack_28.m_exprFlags;
      VariableManager::getEnd<rsg::(anonymous_namespace)::IsReadableEntry>
                (&local_188,pVVar10,IStack_28);
      first_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      .m_end._M_current =
           local_168.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
           .m_end._M_current;
      first_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      .m_iter._M_current =
           local_168.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
           .m_iter._M_current;
      first_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      .m_filter.m_exprFlags =
           local_168.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
           .m_filter.m_exprFlags;
      first_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      ._20_4_ = local_168.
                super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
                ._20_4_;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      .m_end._M_current =
           local_188.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
           .m_end._M_current;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      .m_iter._M_current =
           local_188.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
           .m_iter._M_current;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      .m_filter.m_exprFlags =
           local_188.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
           .m_filter.m_exprFlags;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
      ._20_4_ = local_188.
                super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableEntry>
                ._20_4_;
      pVVar16 = de::Random::
                choose<rsg::ValueEntry_const*,rsg::ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableEntry>>
                          (pRVar15,first_00,last);
      pVVar11 = ValueEntry::getVariable(pVVar16);
      (this->super_VariableAccess).m_variable = pVVar11;
    }
    else {
      computeRandomType(&local_108,state,iVar6);
      ValueRange::ValueRange((ValueRange *)local_b8,&local_108);
      VariableType::~VariableType(&local_108);
      ValueRange::asAccess(&local_120,(ValueRange *)local_b8);
      valueRange_00.super_ConstValueRangeAccess.m_min = local_120.super_ConstValueRangeAccess.m_min;
      valueRange_00.super_ConstValueRangeAccess.m_type =
           local_120.super_ConstValueRangeAccess.m_type;
      valueRange_00.super_ConstValueRangeAccess.m_max = local_120.super_ConstValueRangeAccess.m_max;
      computeRandomValueRange(state,valueRange_00);
      ValueRange::asAccess(&local_150,(ValueRange *)local_b8);
      local_128 = local_150.super_ConstValueRangeAccess.m_max;
      local_138 = local_150.super_ConstValueRangeAccess.m_type;
      pSStack_130 = local_150.super_ConstValueRangeAccess.m_min;
      CVar2.m_min = local_150.super_ConstValueRangeAccess.m_min;
      CVar2.m_type = local_150.super_ConstValueRangeAccess.m_type;
      CVar2.m_max = local_150.super_ConstValueRangeAccess.m_max;
      pVVar11 = rsg::anon_unknown_0::allocateNewVariable(state,CVar2);
      (this->super_VariableAccess).m_variable = pVVar11;
      ValueRange::~ValueRange((ValueRange *)local_b8);
    }
  }
  else {
    pVVar10 = GeneratorState::getVariableManager(state);
    pSVar3 = valueRange.m_max;
    end.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
    .m_filter.m_valueRange.m_max = (Scalar *)valueRange.m_type;
    pSVar18 = valueRange.m_min;
    dVar7 = GeneratorState::getExpressionFlags(state);
    valueRange_01.m_min = pSVar18;
    valueRange_01.m_type =
         (VariableType *)
         end.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
         .m_filter.m_valueRange.m_max;
    valueRange_01.m_max = pSVar3;
    rsg::anon_unknown_0::IsReadableIntersectingEntry::IsReadableIntersectingEntry
              (&local_1e0,valueRange_01,dVar7);
    filter_00.m_valueRange.m_type = local_1e0.m_valueRange.m_type;
    filter_00.super_IsReadableEntry.m_exprFlags = local_1e0.super_IsReadableEntry.m_exprFlags;
    filter_00._4_4_ = local_1e0._4_4_;
    filter_00.m_valueRange.m_min = local_1e0.m_valueRange.m_min;
    filter_00.m_valueRange.m_max = local_1e0.m_valueRange.m_max;
    VariableManager::getBegin<rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
              ((ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry> *)
               auStack_1c0,pVVar10,filter_00);
    pVVar10 = GeneratorState::getVariableManager(state);
    CVar2 = valueRange;
    dVar7 = GeneratorState::getExpressionFlags(state);
    rsg::anon_unknown_0::IsReadableIntersectingEntry::IsReadableIntersectingEntry
              (&local_248,CVar2,dVar7);
    filter_01.m_valueRange.m_type = local_248.m_valueRange.m_type;
    filter_01.super_IsReadableEntry.m_exprFlags = local_248.super_IsReadableEntry.m_exprFlags;
    filter_01._4_4_ = local_248._4_4_;
    filter_01.m_valueRange.m_min = local_248.m_valueRange.m_min;
    filter_01.m_valueRange.m_max = local_248.m_valueRange.m_max;
    VariableManager::getEnd<rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
              ((ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry> *)
               auStack_228,pVVar10,filter_01);
    pVVar8 = ConstValueRangeAccess::getType(&valueRange);
    bVar4 = rsg::anon_unknown_0::canAllocateVariable(state,pVVar8);
    local_52a = false;
    if (bVar4) {
      bVar4 = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
              ::operator==((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
                            *)auStack_1c0,
                           (FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
                            *)auStack_228);
      local_52c = true;
      if (!bVar4) {
        pRVar15 = GeneratorState::getRandom(state);
        local_52c = rsg::anon_unknown_0::getWeightedBool(pRVar15,0.5);
      }
      local_52a = local_52c;
    }
    if (local_52a == false) {
      ppfVar1 = &weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::vector
                ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                 ppfVar1);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)(auStack_2d0 + 0x18));
      auStack_2d0._8_8_ =
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           .m_filter.m_valueRange.m_type;
      auStack_2d0._16_8_ =
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           .m_filter.m_valueRange.m_min;
      local_2d8 = first.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
                  .m_end._M_current;
      auStack_2d0._0_8_ =
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           .m_filter._0_8_;
      IStack_300.m_valueRange.m_max = (Scalar *)auStack_1c0;
      ppVStack_2e0 = first.
                     super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
                     .m_iter._M_current;
      IStack_300.m_valueRange.m_type =
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           .m_filter.m_valueRange.m_type;
      IStack_300.m_valueRange.m_min =
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           .m_filter.m_valueRange.m_min;
      local_308 = end.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
                  .m_end._M_current;
      IStack_300.super_IsReadableEntry.m_exprFlags =
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           .m_filter.super_IsReadableEntry.m_exprFlags;
      IStack_300._4_4_ =
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           .m_filter._4_4_;
      local_318 = (Scalar *)auStack_228;
      ppVStack_310 = end.
                     super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
                     .m_iter._M_current;
      local_330 = (ValueEntry **)
                  std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
                  begin((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *
                        )ppfVar1);
      local_328 = std::
                  inserter<std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>
                            ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                              *)ppfVar1,(iterator)local_330);
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_end._M_current = ppVStack_2e0;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_iter._M_current = (ValueEntry **)IStack_300.m_valueRange.m_max;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter._0_8_ = local_2d8;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter.m_valueRange.m_type = (VariableType *)auStack_2d0._0_8_;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter.m_valueRange.m_min = (Scalar *)auStack_2d0._8_8_;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter.m_valueRange.m_max = (Scalar *)auStack_2d0._16_8_;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_end._M_current = ppVStack_310;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_iter._M_current = (ValueEntry **)local_318;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter._0_8_ = local_308;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter.m_valueRange.m_type = (VariableType *)IStack_300._0_8_;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter.m_valueRange.m_min = (Scalar *)IStack_300.m_valueRange.m_type;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
      .m_filter.m_valueRange.m_max = IStack_300.m_valueRange.m_min;
      pSVar18 = local_318;
      _auStack_340 = std::
                     copy<rsg::ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry>,std::insert_iterator<std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>>
                               (__first,__last,local_328);
      sVar12 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::size
                         ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                           *)&weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)(auStack_2d0 + 0x18),sVar12);
      local_344 = 0;
      while( true ) {
        iVar6 = local_344;
        sVar12 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
                 size((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                      &weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
        if ((int)sVar12 <= iVar6) break;
        ppVVar13 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
                   operator[]((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                               *)&weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)local_344);
        ValueEntry::getValueRange(&local_360,*ppVVar13);
        CVar2 = valueRange;
        entryValueRange.m_min = local_360.m_max;
        entryValueRange.m_type = (VariableType *)local_360.m_min;
        entryValueRange.m_max = (Scalar *)valueRange.m_type;
        readValueRange.m_max = pSVar18;
        readValueRange.m_type = (VariableType *)valueRange.m_min;
        readValueRange.m_min = valueRange.m_max;
        valueRange = CVar2;
        fVar17 = rsg::anon_unknown_0::computeEntryReadWeight(entryValueRange,readValueRange);
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)(auStack_2d0 + 0x18),
                             (long)local_344);
        *pvVar14 = fVar17;
        local_344 = local_344 + 1;
      }
      pRVar15 = GeneratorState::getRandom(state);
      ppfVar1 = &weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      first_01 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
                 begin((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                       ppfVar1);
      last_00 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                          ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                            *)ppfVar1);
      intersection.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)(auStack_2d0 + 0x18));
      pVVar16 = de::Random::
                chooseWeighted<rsg::ValueEntry_const*,__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                          (pRVar15,(__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                                    )first_01._M_current,
                           (__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                            )last_00._M_current,
                           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                           intersection.m_max.
                           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      pVVar11 = ValueEntry::getVariable(pVVar16);
      (this->super_VariableAccess).m_variable = pVVar11;
      pVVar8 = rsg::Variable::getType((this->super_VariableAccess).m_variable);
      ValueRange::ValueRange((ValueRange *)local_418,pVVar8);
      ValueEntry::getValueRange(&local_430,pVVar16);
      ValueRange::computeIntersection((ValueRange *)local_418,&local_430,&valueRange);
      pVVar10 = GeneratorState::getVariableManager(state);
      pVVar11 = (this->super_VariableAccess).m_variable;
      ValueRange::asAccess(&local_460,(ValueRange *)local_418);
      local_438 = local_460.super_ConstValueRangeAccess.m_max;
      local_448 = local_460.super_ConstValueRangeAccess.m_type;
      pSStack_440 = local_460.super_ConstValueRangeAccess.m_min;
      value.m_min = local_460.super_ConstValueRangeAccess.m_min;
      value.m_type = local_460.super_ConstValueRangeAccess.m_type;
      value.m_max = local_460.super_ConstValueRangeAccess.m_max;
      VariableManager::setValue(pVVar10,pVVar11,value);
      ValueRange::~ValueRange((ValueRange *)local_418);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)(auStack_2d0 + 0x18));
      std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::~vector
                ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                 &weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      pVVar11 = rsg::anon_unknown_0::allocateNewVariable(state,valueRange);
      (this->super_VariableAccess).m_variable = pVVar11;
    }
  }
  return;
}

Assistant:

VariableRead::VariableRead (GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
	{
		IsReadableEntry	filter			= IsReadableEntry(state.getExpressionFlags());
		int				maxScalars		= state.getShaderParameters().maxCombinedVariableScalars - state.getVariableManager().getNumAllocatedScalars();
		bool			useRandomRange	= !state.getVariableManager().hasEntry(filter) || ((maxScalars > 0) && getWeightedBool(state.getRandom(), 0.5f));

		if (useRandomRange)
		{
			// Allocate a new variable
			DE_ASSERT(maxScalars > 0);
			ValueRange newVarRange(computeRandomType(state, maxScalars));
			computeRandomValueRange(state, newVarRange.asAccess());

			m_variable = allocateNewVariable(state, newVarRange.asAccess());
		}
		else
		{
			// Use random entry \todo [pyry] Handle -inf..inf ranges?
			m_variable = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin(filter), state.getVariableManager().getEnd(filter))->getVariable();
		}
	}
	else
	{
		// Find variable that has value range that intersects with given range
		IsReadableIntersectingEntry::Iterator	first	= state.getVariableManager().getBegin(IsReadableIntersectingEntry(valueRange, state.getExpressionFlags()));
		IsReadableIntersectingEntry::Iterator	end		= state.getVariableManager().getEnd(IsReadableIntersectingEntry(valueRange, state.getExpressionFlags()));

		const float	createOnReadWeight		= 0.5f;
		bool		createVar				= canAllocateVariable(state, valueRange.getType()) && (first == end || getWeightedBool(state.getRandom(), createOnReadWeight));

		if (createVar)
		{
			m_variable = allocateNewVariable(state, valueRange);
		}
		else
		{
			// Copy value entries for computing weights.
			std::vector<const ValueEntry*>	availableVars;
			std::vector<float>				weights;

			std::copy(first, end, std::inserter(availableVars, availableVars.begin()));

			// Compute weights.
			weights.resize(availableVars.size());
			for (int ndx = 0; ndx < (int)availableVars.size(); ndx++)
				weights[ndx] = computeEntryReadWeight(availableVars[ndx]->getValueRange(), valueRange);

			// Select.
			const ValueEntry* entry = state.getRandom().chooseWeighted<const ValueEntry*>(availableVars.begin(), availableVars.end(), weights.begin());
			m_variable = entry->getVariable();

			// Compute intersection
			ValueRange intersection(m_variable->getType());
			ValueRange::computeIntersection(intersection, entry->getValueRange(), valueRange);
			state.getVariableManager().setValue(m_variable, intersection.asAccess());
		}
	}
}